

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O0

void __thiscall ssl_credential_st::ClearCertAndKey(ssl_credential_st *this)

{
  ssl_credential_st *this_local;
  
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=(&this->pubkey,(nullptr_t)0x0);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=(&this->privkey,(nullptr_t)0x0);
  this->key_method = (SSL_PRIVATE_KEY_METHOD *)0x0;
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::operator=
            (&this->chain,(nullptr_t)0x0);
  return;
}

Assistant:

void ssl_credential_st::ClearCertAndKey() {
  pubkey = nullptr;
  privkey = nullptr;
  key_method = nullptr;
  chain = nullptr;
}